

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

void Js::JavascriptString::CopyHelper(char16 *dst,char16 *str,charcount_t countNeeded)

{
  ulong sizeInWords;
  
  sizeInWords = (ulong)countNeeded;
  switch(sizeInWords) {
  case 0:
    goto switchD_00d10ca8_caseD_0;
  case 1:
    *dst = *str;
    return;
  case 2:
    goto switchD_00d10ca8_caseD_2;
  case 3:
    dst[2] = str[2];
    goto switchD_00d10ca8_caseD_2;
  case 4:
    goto switchD_00d10ca8_caseD_4;
  case 5:
    dst[4] = str[4];
    goto switchD_00d10ca8_caseD_4;
  case 6:
    goto switchD_00d10ca8_caseD_6;
  case 7:
    dst[6] = str[6];
    goto switchD_00d10ca8_caseD_6;
  case 8:
    break;
  case 9:
    dst[8] = str[8];
    break;
  case 10:
    *(undefined4 *)(dst + 8) = *(undefined4 *)(str + 8);
    break;
  default:
    js_wmemcpy_s(dst,sizeInWords,str,sizeInWords);
    return;
  }
  *(undefined4 *)(dst + 6) = *(undefined4 *)(str + 6);
switchD_00d10ca8_caseD_6:
  *(undefined4 *)(dst + 4) = *(undefined4 *)(str + 4);
switchD_00d10ca8_caseD_4:
  *(undefined4 *)(dst + 2) = *(undefined4 *)(str + 2);
switchD_00d10ca8_caseD_2:
  *(undefined4 *)dst = *(undefined4 *)str;
switchD_00d10ca8_caseD_0:
  return;
}

Assistant:

void JavascriptString::CopyHelper(__out_ecount(countNeeded) char16 *dst, __in_ecount(countNeeded) const char16 * str, charcount_t countNeeded)
    {
        switch(countNeeded)
        {
        case 0:
            return;
        case 1:
            dst[0] = str[0];
            break;
        case 3:
            dst[2] = str[2];
            goto case_2;
        case 5:
            dst[4] = str[4];
            goto case_4;
        case 7:
            dst[6] = str[6];
            goto case_6;
        case 9:
            dst[8] = str[8];
            goto case_8;

        case 10:
            *(uint32 *)(dst+8) = *(uint32*)(str+8);
            // FALLTHROUGH
        case 8:
case_8:
            *(uint32 *)(dst+6) = *(uint32*)(str+6);
            // FALLTHROUGH
        case 6:
case_6:
            *(uint32 *)(dst+4) = *(uint32*)(str+4);
            // FALLTHROUGH
        case 4:
case_4:
            *(uint32 *)(dst+2) = *(uint32*)(str+2);
            // FALLTHROUGH
        case 2:
case_2:
            *(uint32 *)(dst) = *(uint32*)str;
            break;

        default:
            js_wmemcpy_s(dst, countNeeded, str, countNeeded);
        }
    }